

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O3

void test_ecdsa_edge_cases(void)

{
  char *pcVar1;
  char cVar2;
  undefined8 uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  int iVar8;
  long lVar9;
  secp256k1_context *extraout_RAX;
  secp256k1_context *extraout_RAX_00;
  secp256k1_context *psVar10;
  secp256k1_scalar *r;
  secp256k1_scalar *psVar11;
  uchar *p1;
  uchar *noncedata;
  long lVar12;
  code *pcVar13;
  bool bVar14;
  secp256k1_scalar sr;
  secp256k1_scalar ss;
  unsigned_long _zzq_result_3;
  int32_t ecount;
  secp256k1_scalar ss_2;
  secp256k1_scalar msg;
  secp256k1_ecdsa_signature sig;
  secp256k1_gej keyj;
  undefined1 local_4188 [16];
  undefined1 auStack_4178 [16];
  undefined1 local_4168 [8];
  ulong uStack_4160;
  undefined1 auStack_4158 [16];
  undefined8 local_4140;
  ulong local_4138 [4];
  secp256k1_scalar local_4118;
  undefined1 local_40f8 [8];
  uint64_t uStack_40f0;
  uint64_t local_40e8;
  uint64_t uStack_40e0;
  uchar local_40d8;
  uint local_40ac;
  secp256k1_ge local_40a8;
  secp256k1_gej local_4038 [53];
  uint64_t auStack_2038 [1025];
  
  psVar11 = (secp256k1_scalar *)local_4188;
  r = (secp256k1_scalar *)local_4168;
  _local_4168 = ZEXT816(1);
  auStack_4158 = ZEXT816(0);
  secp256k1_scalar_negate(r,r);
  secp256k1_scalar_inverse(r,r);
  local_4188 = ZEXT816(1);
  auStack_4178 = ZEXT816(0);
  secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,local_4038,(secp256k1_scalar *)local_4188);
  secp256k1_ge_set_gej(&local_40a8,local_4038);
  local_40e8 = auStack_4158._0_8_;
  uStack_40e0 = auStack_4158._8_8_;
  _local_40f8 = _local_4168;
  iVar8 = secp256k1_ecdsa_sig_verify
                    ((secp256k1_scalar *)local_4188,r,&local_40a8,(secp256k1_scalar *)local_40f8);
  if (iVar8 != 0) goto LAB_0015d82d;
  local_4188 = ZEXT816(1);
  auStack_4178 = ZEXT816(0);
  local_40a8.x.n[0] = 0;
  local_40a8.x.n[1] = 0;
  local_40a8.x.n[2] = 0;
  local_40a8.x.n[3] = 0;
  _local_40f8 = ZEXT816(0);
  local_40e8 = 0;
  uStack_40e0 = 0;
  iVar8 = secp256k1_eckey_pubkey_parse((secp256k1_ge *)local_4038,&DAT_0017e910,0x21);
  if (iVar8 == 0) goto LAB_0015d832;
  iVar8 = secp256k1_ecdsa_sig_verify
                    ((secp256k1_scalar *)local_40f8,(secp256k1_scalar *)local_4188,
                     (secp256k1_ge *)local_4038,(secp256k1_scalar *)&local_40a8);
  if (iVar8 != 0) goto LAB_0015d837;
  local_40a8.x.n[1] = 0;
  local_40a8.x.n[2] = 0;
  local_40a8.x.n[3] = 0;
  local_40a8.x.n[0] = 2;
  local_40a8.x.n[4]._0_1_ = 1;
  auStack_4158 = ZEXT816(0);
  _local_4168 = ZEXT816(0);
  _local_40f8 = ZEXT816(0);
  local_40e8 = 0;
  uStack_40e0 = 0;
  local_4188 = ZEXT816(1);
  auStack_4178 = ZEXT816(0);
  iVar8 = secp256k1_eckey_pubkey_parse((secp256k1_ge *)local_4038,(uchar *)&local_40a8,0x21);
  if (iVar8 == 0) goto LAB_0015d83c;
  iVar8 = secp256k1_ecdsa_sig_verify
                    ((secp256k1_scalar *)local_4188,(secp256k1_scalar *)local_4168,
                     (secp256k1_ge *)local_4038,(secp256k1_scalar *)local_40f8);
  if (iVar8 != 0) goto LAB_0015d841;
  local_40e8 = 0;
  uStack_40e0 = 0;
  stack0xffffffffffffbf09 = ZEXT715(0);
  local_40f8[0] = 2;
  local_40d8 = '\x02';
  local_4118.d[0] = 2;
  local_4118.d[1] = 0;
  local_4118.d[2] = 0;
  local_4118.d[3] = 0;
  local_4188 = ZEXT816(0);
  auStack_4178 = ZEXT816(0);
  _local_4168 = ZEXT816(2);
  auStack_4158 = ZEXT816(0);
  iVar8 = secp256k1_eckey_pubkey_parse((secp256k1_ge *)local_4038,local_40f8,0x21);
  if (iVar8 == 0) goto LAB_0015d846;
  iVar8 = secp256k1_eckey_pubkey_parse(&local_40a8,&DAT_0017e940,0x21);
  if (iVar8 == 0) goto LAB_0015d84b;
  iVar8 = secp256k1_ecdsa_sig_verify
                    ((secp256k1_scalar *)local_4168,&local_4118,(secp256k1_ge *)local_4038,
                     (secp256k1_scalar *)local_4188);
  if (iVar8 == 0) goto LAB_0015d850;
  iVar8 = secp256k1_ecdsa_sig_verify
                    ((secp256k1_scalar *)local_4168,&local_4118,&local_40a8,
                     (secp256k1_scalar *)local_4188);
  if (iVar8 == 0) goto LAB_0015d855;
  r = &local_4118;
  secp256k1_scalar_negate(r,r);
  iVar8 = secp256k1_ecdsa_sig_verify
                    ((secp256k1_scalar *)local_4168,r,(secp256k1_ge *)local_4038,
                     (secp256k1_scalar *)local_4188);
  if (iVar8 == 0) goto LAB_0015d85a;
  iVar8 = secp256k1_ecdsa_sig_verify
                    ((secp256k1_scalar *)local_4168,&local_4118,&local_40a8,
                     (secp256k1_scalar *)local_4188);
  if (iVar8 == 0) goto LAB_0015d85f;
  local_4118.d[0] = 1;
  local_4118.d[1] = 0;
  local_4118.d[2] = 0;
  local_4118.d[3] = 0;
  iVar8 = secp256k1_ecdsa_sig_verify
                    ((secp256k1_scalar *)local_4168,&local_4118,(secp256k1_ge *)local_4038,
                     (secp256k1_scalar *)local_4188);
  if (iVar8 != 0) goto LAB_0015d864;
  iVar8 = secp256k1_ecdsa_sig_verify
                    ((secp256k1_scalar *)local_4168,&local_4118,&local_40a8,
                     (secp256k1_scalar *)local_4188);
  if (iVar8 != 0) goto LAB_0015d869;
  _local_4168 = ZEXT816(1);
  auStack_4158 = ZEXT816(0);
  _local_40f8 = ZEXT816(1);
  local_40e8 = 0;
  uStack_40e0 = 0;
  secp256k1_scalar_set_b32((secp256k1_scalar *)local_4188,"",(int *)0x0);
  iVar8 = secp256k1_eckey_pubkey_parse((secp256k1_ge *)local_4038,&DAT_0017e970,0x21);
  if (iVar8 == 0) goto LAB_0015d86e;
  iVar8 = secp256k1_eckey_pubkey_parse(&local_40a8,&DAT_0017e9a0,0x21);
  if (iVar8 == 0) goto LAB_0015d873;
  iVar8 = secp256k1_ecdsa_sig_verify
                    ((secp256k1_scalar *)local_4188,(secp256k1_scalar *)local_4168,
                     (secp256k1_ge *)local_4038,(secp256k1_scalar *)local_40f8);
  if (iVar8 == 0) goto LAB_0015d878;
  iVar8 = secp256k1_ecdsa_sig_verify
                    ((secp256k1_scalar *)local_4188,(secp256k1_scalar *)local_4168,&local_40a8,
                     (secp256k1_scalar *)local_40f8);
  if (iVar8 == 0) goto LAB_0015d87d;
  r = (secp256k1_scalar *)local_4168;
  secp256k1_scalar_negate(r,r);
  iVar8 = secp256k1_ecdsa_sig_verify
                    ((secp256k1_scalar *)local_4188,r,(secp256k1_ge *)local_4038,
                     (secp256k1_scalar *)local_40f8);
  if (iVar8 == 0) goto LAB_0015d882;
  iVar8 = secp256k1_ecdsa_sig_verify
                    ((secp256k1_scalar *)local_4188,(secp256k1_scalar *)local_4168,&local_40a8,
                     (secp256k1_scalar *)local_40f8);
  if (iVar8 == 0) goto LAB_0015d887;
  _local_4168 = ZEXT816(2);
  auStack_4158 = ZEXT816(0);
  r = (secp256k1_scalar *)local_4168;
  secp256k1_scalar_inverse_var(r,r);
  iVar8 = secp256k1_ecdsa_sig_verify
                    ((secp256k1_scalar *)local_4188,r,(secp256k1_ge *)local_4038,
                     (secp256k1_scalar *)local_40f8);
  if (iVar8 != 0) goto LAB_0015d88c;
  iVar8 = secp256k1_ecdsa_sig_verify
                    ((secp256k1_scalar *)local_4188,(secp256k1_scalar *)local_4168,&local_40a8,
                     (secp256k1_scalar *)local_40f8);
  if (iVar8 != 0) goto LAB_0015d891;
  local_4188 = ZEXT816(1);
  auStack_4178 = ZEXT816(0);
  local_40a8.x.n[0] = 1;
  local_40a8.x.n[1] = 0;
  local_40a8.x.n[2] = 0;
  local_40a8.x.n[3] = 0;
  secp256k1_scalar_negate((secp256k1_scalar *)&local_40a8,(secp256k1_scalar *)&local_40a8);
  secp256k1_scalar_set_b32((secp256k1_scalar *)local_40f8,"",(int *)0x0);
  iVar8 = secp256k1_eckey_pubkey_parse((secp256k1_ge *)local_4038,&DAT_0017e9d0,0x21);
  if (iVar8 == 0) goto LAB_0015d896;
  iVar8 = secp256k1_ecdsa_sig_verify
                    ((secp256k1_scalar *)local_40f8,(secp256k1_scalar *)local_4188,
                     (secp256k1_ge *)local_4038,(secp256k1_scalar *)&local_40a8);
  if (iVar8 == 0) goto LAB_0015d89b;
  secp256k1_scalar_negate((secp256k1_scalar *)local_4188,(secp256k1_scalar *)local_4188);
  iVar8 = secp256k1_ecdsa_sig_verify
                    ((secp256k1_scalar *)local_40f8,(secp256k1_scalar *)local_4188,
                     (secp256k1_ge *)local_4038,(secp256k1_scalar *)&local_40a8);
  r = (secp256k1_scalar *)local_4188;
  if (iVar8 == 0) goto LAB_0015d8a0;
  local_4188 = ZEXT816(3);
  auStack_4178 = ZEXT816(0);
  secp256k1_scalar_inverse_var((secp256k1_scalar *)local_4188,(secp256k1_scalar *)local_4188);
  iVar8 = secp256k1_ecdsa_sig_verify
                    ((secp256k1_scalar *)local_40f8,(secp256k1_scalar *)local_4188,
                     (secp256k1_ge *)local_4038,(secp256k1_scalar *)&local_40a8);
  psVar10 = CTX;
  if (iVar8 != 0) goto LAB_0015d8a5;
  auStack_4178 = ZEXT816((ulong)0x100000000000000) << 0x40;
  local_4188 = ZEXT816(0);
  auStack_4158._8_8_ = 0xa9293eb931dddf65;
  auStack_4158._0_8_ = 0x62777a810be012b8;
  uStack_4160 = 0xf7f478316a9d5faa;
  local_4168 = (undefined1  [8])0x5344230681994186;
  local_4138[0] = local_4138[0] & 0xffffffff00000000;
  psVar11 = (secp256k1_scalar *)local_4188;
  if (secp256k1_context_static == CTX) goto LAB_0015d8aa;
  (CTX->illegal_callback).fn = counting_illegal_callback_fn;
  (psVar10->illegal_callback).data = local_4138;
  psVar11 = (secp256k1_scalar *)local_4188;
LAB_0015c9c0:
  iVar8 = secp256k1_ecdsa_sign
                    (psVar10,(secp256k1_ecdsa_signature *)&local_40a8,local_4168,local_4188,
                     precomputed_nonce_function,"");
  if (iVar8 == 0) {
    iVar8 = secp256k1_ecdsa_sign
                      (CTX,(secp256k1_ecdsa_signature *)&local_40a8,local_4168,local_4188,
                       precomputed_nonce_function,test_ecdsa_edge_cases::nonce2);
    if (iVar8 != 0) goto LAB_0015d8cf;
    auStack_4158[0xf] = 0xaa;
    iVar8 = secp256k1_ecdsa_sign
                      (CTX,(secp256k1_ecdsa_signature *)&local_40a8,local_4168,local_4188,
                       precomputed_nonce_function,"");
    if (iVar8 != 1) goto LAB_0015d8d4;
    if ((int)local_4138[0] != 0) goto LAB_0015d8d9;
    iVar8 = secp256k1_ecdsa_sign
                      (CTX,(secp256k1_ecdsa_signature *)0x0,local_4168,local_4188,
                       precomputed_nonce_function,test_ecdsa_edge_cases::nonce2);
    if (iVar8 != 0) goto LAB_0015d8de;
    if ((int)local_4138[0] != 1) goto LAB_0015d8e3;
    iVar8 = secp256k1_ecdsa_sign
                      (CTX,(secp256k1_ecdsa_signature *)&local_40a8,(uchar *)0x0,local_4188,
                       precomputed_nonce_function,test_ecdsa_edge_cases::nonce2);
    if (iVar8 != 0) goto LAB_0015d8e8;
    if ((int)local_4138[0] != 2) goto LAB_0015d8ed;
    iVar8 = secp256k1_ecdsa_sign
                      (CTX,(secp256k1_ecdsa_signature *)&local_40a8,local_4168,(uchar *)0x0,
                       precomputed_nonce_function,test_ecdsa_edge_cases::nonce2);
    if (iVar8 != 0) goto LAB_0015d8f2;
    if ((int)local_4138[0] != 3) goto LAB_0015d8f7;
    iVar8 = secp256k1_ecdsa_sign
                      (CTX,(secp256k1_ecdsa_signature *)&local_40a8,local_4168,local_4188,
                       precomputed_nonce_function,test_ecdsa_edge_cases::nonce2);
    if (iVar8 != 1) goto LAB_0015d8fc;
    iVar8 = secp256k1_ec_pubkey_create(CTX,(secp256k1_pubkey *)local_40f8,local_4188);
    if (iVar8 == 0) goto LAB_0015d901;
    iVar8 = secp256k1_ecdsa_verify
                      (CTX,(secp256k1_ecdsa_signature *)0x0,local_4168,
                       (secp256k1_pubkey *)local_40f8);
    if (iVar8 != 0) goto LAB_0015d906;
    if ((int)local_4138[0] != 4) goto LAB_0015d90b;
    iVar8 = secp256k1_ecdsa_verify
                      (CTX,(secp256k1_ecdsa_signature *)&local_40a8,(uchar *)0x0,
                       (secp256k1_pubkey *)local_40f8);
    if (iVar8 != 0) goto LAB_0015d910;
    if ((int)local_4138[0] != 5) goto LAB_0015d915;
    iVar8 = secp256k1_ecdsa_verify
                      (CTX,(secp256k1_ecdsa_signature *)&local_40a8,local_4168,
                       (secp256k1_pubkey *)0x0);
    if (iVar8 != 0) goto LAB_0015d91a;
    if ((int)local_4138[0] != 6) goto LAB_0015d91f;
    iVar8 = secp256k1_ecdsa_verify
                      (CTX,(secp256k1_ecdsa_signature *)&local_40a8,local_4168,
                       (secp256k1_pubkey *)local_40f8);
    if (iVar8 == 0) goto LAB_0015d924;
    if ((int)local_4138[0] != 6) goto LAB_0015d929;
    iVar8 = secp256k1_ec_pubkey_create(CTX,(secp256k1_pubkey *)local_40f8,(uchar *)0x0);
    if (iVar8 != 0) goto LAB_0015d92e;
    if ((int)local_4138[0] != 7) goto LAB_0015d933;
    iVar8 = secp256k1_ecdsa_verify
                      (CTX,(secp256k1_ecdsa_signature *)&local_40a8,local_4168,
                       (secp256k1_pubkey *)local_40f8);
    if (iVar8 != 0) goto LAB_0015d938;
    if ((int)local_4138[0] != 8) goto LAB_0015d93d;
    local_4118.d[0] = 0x48;
    iVar8 = secp256k1_ecdsa_signature_serialize_der
                      (CTX,(uchar *)0x0,local_4118.d,(secp256k1_ecdsa_signature *)&local_40a8);
    if (iVar8 != 0) goto LAB_0015d942;
    if ((int)local_4138[0] != 9) goto LAB_0015d947;
    iVar8 = secp256k1_ecdsa_signature_serialize_der
                      (CTX,(uchar *)local_4038,(size_t *)0x0,
                       (secp256k1_ecdsa_signature *)&local_40a8);
    if (iVar8 != 0) goto LAB_0015d94c;
    if ((int)local_4138[0] != 10) goto LAB_0015d951;
    iVar8 = secp256k1_ecdsa_signature_serialize_der
                      (CTX,(uchar *)local_4038,local_4118.d,(secp256k1_ecdsa_signature *)0x0);
    if (iVar8 != 0) goto LAB_0015d956;
    if ((int)local_4138[0] != 0xb) goto LAB_0015d95b;
    iVar8 = secp256k1_ecdsa_signature_serialize_der
                      (CTX,(uchar *)local_4038,local_4118.d,(secp256k1_ecdsa_signature *)&local_40a8
                      );
    if (iVar8 == 0) goto LAB_0015d960;
    if ((int)local_4138[0] != 0xb) goto LAB_0015d965;
    iVar8 = secp256k1_ecdsa_signature_parse_der
                      (CTX,(secp256k1_ecdsa_signature *)0x0,(uchar *)local_4038,local_4118.d[0]);
    if (iVar8 != 0) goto LAB_0015d96a;
    if ((int)local_4138[0] != 0xc) goto LAB_0015d96f;
    iVar8 = secp256k1_ecdsa_signature_parse_der
                      (CTX,(secp256k1_ecdsa_signature *)&local_40a8,(uchar *)0x0,local_4118.d[0]);
    if (iVar8 != 0) goto LAB_0015d974;
    if ((int)local_4138[0] != 0xd) goto LAB_0015d979;
    iVar8 = secp256k1_ecdsa_signature_parse_der
                      (CTX,(secp256k1_ecdsa_signature *)&local_40a8,(uchar *)local_4038,
                       local_4118.d[0]);
    if (iVar8 == 0) goto LAB_0015d97e;
    if ((int)local_4138[0] != 0xd) goto LAB_0015d983;
    local_4118.d[0] = 10;
    iVar8 = secp256k1_ecdsa_signature_serialize_der
                      (CTX,(uchar *)local_4038,local_4118.d,(secp256k1_ecdsa_signature *)&local_40a8
                      );
    if (iVar8 != 0) goto LAB_0015d988;
    if ((int)local_4138[0] != 0xd) goto LAB_0015d98d;
    local_4138[0] = local_4138[0] & 0xffffffff00000000;
    iVar8 = secp256k1_ecdsa_signature_normalize
                      (CTX,(secp256k1_ecdsa_signature *)0x0,(secp256k1_ecdsa_signature *)0x0);
    if (iVar8 != 0) goto LAB_0015d992;
    if ((int)local_4138[0] != 1) goto LAB_0015d997;
    iVar8 = secp256k1_ecdsa_signature_serialize_compact
                      (CTX,(uchar *)0x0,(secp256k1_ecdsa_signature *)&local_40a8);
    if (iVar8 != 0) goto LAB_0015d99c;
    if ((int)local_4138[0] != 2) goto LAB_0015d9a1;
    iVar8 = secp256k1_ecdsa_signature_serialize_compact
                      (CTX,(uchar *)local_4038,(secp256k1_ecdsa_signature *)0x0);
    if (iVar8 != 0) goto LAB_0015d9a6;
    if ((int)local_4138[0] != 3) goto LAB_0015d9ab;
    iVar8 = secp256k1_ecdsa_signature_serialize_compact
                      (CTX,(uchar *)local_4038,(secp256k1_ecdsa_signature *)&local_40a8);
    if (iVar8 == 0) goto LAB_0015d9b0;
    if ((int)local_4138[0] != 3) goto LAB_0015d9b5;
    iVar8 = secp256k1_ecdsa_signature_parse_compact
                      (CTX,(secp256k1_ecdsa_signature *)0x0,(uchar *)local_4038);
    if (iVar8 != 0) goto LAB_0015d9ba;
    if ((int)local_4138[0] != 4) goto LAB_0015d9bf;
    iVar8 = secp256k1_ecdsa_signature_parse_compact
                      (CTX,(secp256k1_ecdsa_signature *)&local_40a8,(uchar *)0x0);
    if (iVar8 != 0) goto LAB_0015d9c4;
    if ((int)local_4138[0] != 5) goto LAB_0015d9c9;
    iVar8 = secp256k1_ecdsa_signature_parse_compact
                      (CTX,(secp256k1_ecdsa_signature *)&local_40a8,(uchar *)local_4038);
    if (iVar8 == 0) goto LAB_0015d9ce;
    if ((int)local_4138[0] != 5) goto LAB_0015d9d3;
    local_4038[0].y.n[0]._0_4_ = 0xffffffff;
    local_4038[0].y.n[0]._4_4_ = 0xffffffff;
    local_4038[0].y.n[1]._0_4_ = 0xffffffff;
    local_4038[0].y.n[1]._4_4_ = 0xffffffff;
    local_4038[0].x.n[4] = 0xffffffffffffffff;
    local_4038[0].x.magnitude = -1;
    local_4038[0].x.normalized = -1;
    local_4038[0].x.n[2] = 0xffffffffffffffff;
    local_4038[0].x.n[3] = 0xffffffffffffffff;
    local_4038[0].x.n[0] = 0xffffffffffffffff;
    local_4038[0].x.n[1] = 0xffffffffffffffff;
    iVar8 = secp256k1_ecdsa_signature_parse_compact
                      (CTX,(secp256k1_ecdsa_signature *)&local_40a8,(uchar *)local_4038);
    psVar10 = CTX;
    if (iVar8 != 0) goto LAB_0015d9d8;
    if ((int)local_4138[0] != 5) goto LAB_0015d9dd;
    if (secp256k1_context_static == CTX) goto LAB_0015d9e2;
    (CTX->illegal_callback).fn = secp256k1_default_illegal_callback_fn;
    (psVar10->illegal_callback).data = (void *)0x0;
  }
  else {
    test_ecdsa_edge_cases_cold_9();
LAB_0015d8cf:
    test_ecdsa_edge_cases_cold_10();
LAB_0015d8d4:
    test_ecdsa_edge_cases_cold_11();
LAB_0015d8d9:
    test_ecdsa_edge_cases_cold_12();
LAB_0015d8de:
    test_ecdsa_edge_cases_cold_13();
LAB_0015d8e3:
    test_ecdsa_edge_cases_cold_14();
LAB_0015d8e8:
    test_ecdsa_edge_cases_cold_15();
LAB_0015d8ed:
    test_ecdsa_edge_cases_cold_16();
LAB_0015d8f2:
    test_ecdsa_edge_cases_cold_17();
LAB_0015d8f7:
    test_ecdsa_edge_cases_cold_18();
LAB_0015d8fc:
    test_ecdsa_edge_cases_cold_19();
LAB_0015d901:
    test_ecdsa_edge_cases_cold_92();
LAB_0015d906:
    test_ecdsa_edge_cases_cold_20();
LAB_0015d90b:
    test_ecdsa_edge_cases_cold_21();
LAB_0015d910:
    test_ecdsa_edge_cases_cold_22();
LAB_0015d915:
    test_ecdsa_edge_cases_cold_23();
LAB_0015d91a:
    test_ecdsa_edge_cases_cold_24();
LAB_0015d91f:
    test_ecdsa_edge_cases_cold_25();
LAB_0015d924:
    test_ecdsa_edge_cases_cold_91();
LAB_0015d929:
    test_ecdsa_edge_cases_cold_26();
LAB_0015d92e:
    test_ecdsa_edge_cases_cold_27();
LAB_0015d933:
    test_ecdsa_edge_cases_cold_28();
LAB_0015d938:
    test_ecdsa_edge_cases_cold_29();
LAB_0015d93d:
    test_ecdsa_edge_cases_cold_30();
LAB_0015d942:
    test_ecdsa_edge_cases_cold_31();
LAB_0015d947:
    test_ecdsa_edge_cases_cold_32();
LAB_0015d94c:
    test_ecdsa_edge_cases_cold_33();
LAB_0015d951:
    test_ecdsa_edge_cases_cold_34();
LAB_0015d956:
    test_ecdsa_edge_cases_cold_35();
LAB_0015d95b:
    test_ecdsa_edge_cases_cold_36();
LAB_0015d960:
    test_ecdsa_edge_cases_cold_90();
LAB_0015d965:
    test_ecdsa_edge_cases_cold_37();
LAB_0015d96a:
    test_ecdsa_edge_cases_cold_38();
LAB_0015d96f:
    test_ecdsa_edge_cases_cold_39();
LAB_0015d974:
    test_ecdsa_edge_cases_cold_40();
LAB_0015d979:
    test_ecdsa_edge_cases_cold_41();
LAB_0015d97e:
    test_ecdsa_edge_cases_cold_89();
LAB_0015d983:
    test_ecdsa_edge_cases_cold_42();
LAB_0015d988:
    test_ecdsa_edge_cases_cold_43();
LAB_0015d98d:
    test_ecdsa_edge_cases_cold_44();
LAB_0015d992:
    test_ecdsa_edge_cases_cold_45();
LAB_0015d997:
    test_ecdsa_edge_cases_cold_46();
LAB_0015d99c:
    test_ecdsa_edge_cases_cold_47();
LAB_0015d9a1:
    test_ecdsa_edge_cases_cold_48();
LAB_0015d9a6:
    test_ecdsa_edge_cases_cold_49();
LAB_0015d9ab:
    test_ecdsa_edge_cases_cold_50();
LAB_0015d9b0:
    test_ecdsa_edge_cases_cold_88();
LAB_0015d9b5:
    test_ecdsa_edge_cases_cold_51();
LAB_0015d9ba:
    test_ecdsa_edge_cases_cold_52();
LAB_0015d9bf:
    test_ecdsa_edge_cases_cold_53();
LAB_0015d9c4:
    test_ecdsa_edge_cases_cold_54();
LAB_0015d9c9:
    test_ecdsa_edge_cases_cold_55();
LAB_0015d9ce:
    test_ecdsa_edge_cases_cold_87();
LAB_0015d9d3:
    test_ecdsa_edge_cases_cold_56();
LAB_0015d9d8:
    test_ecdsa_edge_cases_cold_57();
LAB_0015d9dd:
    test_ecdsa_edge_cases_cold_58();
    psVar10 = extraout_RAX_00;
LAB_0015d9e2:
    (*(psVar10->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar10->illegal_callback).data);
  }
  r = (secp256k1_scalar *)CONCAT71((int7)((ulong)psVar11 >> 8),1);
  do {
    noncedata = "";
    if ((char)r != '\0') {
      noncedata = (uchar *)0x0;
    }
    _local_4168 = (undefined1  [16])0x0;
    auStack_4158._0_15_ = SUB1615((undefined1  [16])0x0,0);
    auStack_4158[0xf] = 1;
    local_4188._8_4_ = 0xffffffff;
    local_4188._0_8_ = 0xffffffffffffffff;
    local_4188._12_4_ = 0xffffffff;
    auStack_4178._8_4_ = 0xffffffff;
    auStack_4178._0_8_ = 0xffffffffffffffff;
    auStack_4178._12_4_ = 0xffffffff;
    iVar8 = secp256k1_ecdsa_sign
                      (CTX,(secp256k1_ecdsa_signature *)&local_40a8,local_4168,local_4188,
                       (secp256k1_nonce_function)0x0,noncedata);
    if (iVar8 != 0) goto LAB_0015d7ec;
    lVar9 = 0;
    do {
      cVar2 = *(char *)((long)local_40a8.x.n + lVar9);
      if (cVar2 != '\0') break;
      bVar14 = lVar9 != 0x3f;
      lVar9 = lVar9 + 1;
    } while (bVar14);
    if (cVar2 != '\0') goto LAB_0015d7f1;
    auStack_4178 = (undefined1  [16])0x0;
    local_4188 = (undefined1  [16])0x0;
    iVar8 = secp256k1_ecdsa_sign
                      (CTX,(secp256k1_ecdsa_signature *)&local_40a8,local_4168,local_4188,
                       (secp256k1_nonce_function)0x0,noncedata);
    if (iVar8 != 0) goto LAB_0015d7f6;
    lVar9 = 0;
    do {
      cVar2 = *(char *)((long)local_40a8.x.n + lVar9);
      if (cVar2 != '\0') break;
      bVar14 = lVar9 != 0x3f;
      lVar9 = lVar9 + 1;
    } while (bVar14);
    if (cVar2 != '\0') goto LAB_0015d7fb;
    auStack_4178[0xf] = 1;
    iVar8 = secp256k1_ecdsa_sign
                      (CTX,(secp256k1_ecdsa_signature *)&local_40a8,local_4168,local_4188,
                       nonce_function_test_fail,noncedata);
    if (iVar8 != 0) goto LAB_0015d800;
    lVar9 = 0;
    do {
      cVar2 = *(char *)((long)local_40a8.x.n + lVar9);
      if (cVar2 != '\0') break;
      bVar14 = lVar9 != 0x3f;
      lVar9 = lVar9 + 1;
    } while (bVar14);
    if (cVar2 != '\0') goto LAB_0015d805;
    iVar8 = secp256k1_ecdsa_sign
                      (CTX,(secp256k1_ecdsa_signature *)&local_40a8,local_4168,local_4188,
                       nonce_function_test_retry,noncedata);
    if (iVar8 != 1) goto LAB_0015d80a;
    lVar9 = 0;
    do {
      cVar2 = *(char *)((long)local_40a8.x.n + lVar9);
      if (cVar2 != '\0') break;
      bVar14 = lVar9 != 0x3f;
      lVar9 = lVar9 + 1;
    } while (bVar14);
    if (cVar2 == '\0') goto LAB_0015d80f;
    pcVar13 = nonce_function_rfc6979;
    psVar10 = CTX;
    iVar8 = secp256k1_ecdsa_sign
                      (CTX,(secp256k1_ecdsa_signature *)local_40f8,local_4168,local_4188,
                       nonce_function_rfc6979,noncedata);
    if (iVar8 != 1) goto LAB_0015d814;
    lVar9 = 0;
    do {
      pcVar1 = local_40f8 + lVar9;
      if (*pcVar1 != '\0') break;
      bVar14 = lVar9 != 0x3f;
      lVar9 = lVar9 + 1;
    } while (bVar14);
    if (*pcVar1 == '\0') goto LAB_0015d819;
    lVar9 = 0;
    do {
      if (*(char *)((long)local_40a8.x.n + lVar9) != local_40f8[lVar9]) {
        test_ecdsa_edge_cases_cold_67();
        goto LAB_0015da00;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != 0x40);
    iVar8 = secp256k1_ecdsa_sign
                      (CTX,(secp256k1_ecdsa_signature *)local_40f8,local_4168,local_4188,
                       (secp256k1_nonce_function)0x0,noncedata);
    if (iVar8 != 1) goto LAB_0015d81e;
    lVar9 = 0;
    do {
      pcVar1 = local_40f8 + lVar9;
      if (*pcVar1 != '\0') break;
      bVar14 = lVar9 != 0x3f;
      lVar9 = lVar9 + 1;
    } while (bVar14);
    if (*pcVar1 == '\0') goto LAB_0015d823;
    lVar9 = 0;
    do {
      cVar2 = *(char *)((long)local_40a8.x.n + lVar9);
      pcVar1 = local_40f8 + lVar9;
      if (cVar2 != *pcVar1) break;
      bVar14 = lVar9 != 0x3f;
      lVar9 = lVar9 + 1;
    } while (bVar14);
    if (cVar2 != *pcVar1) goto LAB_0015d828;
    local_40ac = (uint)r;
    lVar9 = 0;
    r = (secp256k1_scalar *)0x0;
    do {
      local_4168[0] = (char)r;
      iVar8 = secp256k1_ecdsa_sign
                        (CTX,(secp256k1_ecdsa_signature *)local_40f8,local_4168,local_4188,
                         (secp256k1_nonce_function)0x0,noncedata);
      if (iVar8 != 1) {
        test_ecdsa_edge_cases_cold_70();
LAB_0015d7dd:
        test_ecdsa_edge_cases_cold_83();
        goto LAB_0015d7e2;
      }
      lVar12 = 0;
      do {
        pcVar1 = local_40f8 + lVar12;
        if (*pcVar1 != '\0') break;
        bVar14 = lVar12 != 0x3f;
        lVar12 = lVar12 + 1;
      } while (bVar14);
      if (*pcVar1 == '\0') goto LAB_0015d7dd;
      local_4038[0].x.n[(long)r * 4 + 2] = local_40e8;
      local_4038[0].x.n[(long)r * 4 + 3] = uStack_40e0;
      local_4038[0].x.n[(long)r * 4] = (uint64_t)local_40f8;
      local_4038[0].x.n[(long)r * 4 + 1] = uStack_40f0;
      if (r != (secp256k1_scalar *)0x0) {
        lVar12 = 0;
        do {
          if ((((local_4038[0].x.n[(long)r * 4] == *(uint64_t *)((long)local_4038[0].x.n + lVar12))
               && (local_4038[0].x.n[(long)r * 4 + 1] ==
                   *(uint64_t *)((long)local_4038[0].x.n + lVar12 + 8))) &&
              (local_4038[0].x.n[(long)r * 4 + 2] ==
               *(uint64_t *)((long)local_4038[0].x.n + lVar12 + 0x10))) &&
             (local_4038[0].x.n[(long)r * 4 + 3] ==
              *(uint64_t *)((long)local_4038[0].x.n + lVar12 + 0x18))) goto LAB_0015d6d5;
          lVar12 = lVar12 + 0x20;
        } while (lVar9 != lVar12);
      }
      r = (secp256k1_scalar *)((long)r->d + 1);
      lVar9 = lVar9 + 0x20;
    } while (r != (secp256k1_scalar *)0x100);
    auVar6[0xf] = 0;
    auVar6._0_15_ = stack0xffffffffffffbe99;
    _local_4168 = auVar6 << 8;
    auStack_4158[0xf] = 2;
    r = (secp256k1_scalar *)0x100;
    lVar9 = 0x2000;
    do {
      local_4188[0] = (char)r;
      iVar8 = secp256k1_ecdsa_sign
                        (CTX,(secp256k1_ecdsa_signature *)local_40f8,local_4168,local_4188,
                         (secp256k1_nonce_function)0x0,noncedata);
      if (iVar8 != 1) goto LAB_0015d7e2;
      lVar12 = 0;
      do {
        pcVar1 = local_40f8 + lVar12;
        if (*pcVar1 != '\0') break;
        bVar14 = lVar12 != 0x3f;
        lVar12 = lVar12 + 1;
      } while (bVar14);
      if (*pcVar1 == '\0') goto LAB_0015d7e7;
      local_4038[0].x.n[(long)r * 4] = (uint64_t)local_40f8;
      local_4038[0].x.n[(long)r * 4 + 1] = uStack_40f0;
      local_4038[0].x.n[(long)r * 4 + 2] = local_40e8;
      local_4038[0].x.n[(long)r * 4 + 3] = uStack_40e0;
      lVar12 = 0;
      do {
        if (((local_4038[0].x.n[(long)r * 4] == *(uint64_t *)((long)local_4038[0].x.n + lVar12)) &&
            (local_4038[0].x.n[(long)r * 4 + 1] ==
             *(uint64_t *)((long)local_4038[0].x.n + lVar12 + 8))) &&
           ((local_4038[0].x.n[(long)r * 4 + 2] ==
             *(uint64_t *)((long)local_4038[0].x.n + lVar12 + 0x10) &&
            (local_4038[0].x.n[(long)r * 4 + 3] ==
             *(uint64_t *)((long)local_4038[0].x.n + lVar12 + 0x18))))) goto LAB_0015d6d0;
        lVar12 = lVar12 + 0x20;
      } while (lVar9 != lVar12);
      r = (secp256k1_scalar *)((long)r->d + 1);
      lVar9 = lVar9 + 0x20;
    } while (r != (secp256k1_scalar *)0x200);
    r = (secp256k1_scalar *)0x0;
  } while ((local_40ac & 1) != 0);
  local_40e8 = 0;
  uStack_40e0 = 0;
  _local_40f8 = (undefined1  [16])0x0;
  lVar9 = 0;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uStack_4160;
  _local_4168 = auVar7 << 0x40;
  local_4118.d[0] = 0;
  local_4038[0].x.n[1] = (uint64_t)local_4138;
  local_4138[0] = 0;
  local_4038[0].x.n[0] = 0x4d430001;
  local_4038[0].x.n[2] = 0x20;
  local_4038[0].x.n[3] = 0;
  local_4038[0].x.n[4] = 0;
  local_4038[0].x.magnitude = 0;
  local_4038[0].x.normalized = 0;
  local_4140 = 0;
  nonce_function_rfc6979(local_4188,local_40f8,local_40f8,(uchar *)0x0,(void *)0x0,0);
  local_4038[0].x.n[0] = 0x4d430005;
  local_4038[0].x.n[2] = 0x20;
  local_4038[0].x.n[3] = 0;
  local_4038[0].x.n[4] = 0;
  local_4038[0].x.magnitude = 0;
  local_4038[0].x.normalized = 0;
  local_4140 = 0;
  local_4038[0].x.n[1] = (uint64_t)local_4188;
  nonce_function_rfc6979(local_4168,local_40f8,local_40f8,local_40f8,(void *)0x0,0);
  local_4038[0].x.n[0] = 0x4d430005;
  local_4038[0].x.n[2] = 0x20;
  local_4038[0].x.n[3] = 0;
  local_4038[0].x.n[4] = 0;
  local_4038[0].x.magnitude = 0;
  local_4038[0].x.normalized = 0;
  local_4140 = 0;
  local_4038[0].x.n[1] = (uint64_t)local_4168;
  nonce_function_rfc6979((uchar *)&local_4118,local_40f8,local_40f8,(uchar *)0x0,local_40f8,0);
  local_4038[0].x.n[0] = 0x4d430005;
  local_4038[0].x.n[2] = 0x20;
  local_4038[0].x.n[3] = 0;
  local_4038[0].x.n[4] = 0;
  local_4038[0].x.magnitude = 0;
  local_4038[0].x.normalized = 0;
  local_4140 = 0;
  local_4038[0].x.n[1] = (uint64_t)&local_4118;
  nonce_function_rfc6979((uchar *)local_4138,local_40f8,local_40f8,local_40f8,local_40f8,0);
  local_4038[0].x.n[0] = 0x4d430005;
  local_4038[0].x.n[1] = (uint64_t)local_4138;
  local_4038[0].x.n[2] = 0x20;
  local_4038[0].x.n[3] = 0;
  local_4038[0].x.n[4] = 0;
  local_4038[0].x.magnitude = 0;
  local_4038[0].x.normalized = 0;
  local_4140 = 0;
  goto LAB_0015d6b9;
LAB_0015d7e2:
  test_ecdsa_edge_cases_cold_72();
LAB_0015d7e7:
  test_ecdsa_edge_cases_cold_82();
LAB_0015d7ec:
  test_ecdsa_edge_cases_cold_59();
LAB_0015d7f1:
  test_ecdsa_edge_cases_cold_60();
LAB_0015d7f6:
  test_ecdsa_edge_cases_cold_61();
LAB_0015d7fb:
  test_ecdsa_edge_cases_cold_62();
LAB_0015d800:
  test_ecdsa_edge_cases_cold_63();
LAB_0015d805:
  test_ecdsa_edge_cases_cold_64();
LAB_0015d80a:
  test_ecdsa_edge_cases_cold_65();
LAB_0015d80f:
  test_ecdsa_edge_cases_cold_86();
LAB_0015d814:
  test_ecdsa_edge_cases_cold_66();
LAB_0015d819:
  test_ecdsa_edge_cases_cold_85();
LAB_0015d81e:
  test_ecdsa_edge_cases_cold_68();
LAB_0015d823:
  test_ecdsa_edge_cases_cold_84();
LAB_0015d828:
  test_ecdsa_edge_cases_cold_69();
LAB_0015d82d:
  test_ecdsa_edge_cases_cold_1();
LAB_0015d832:
  test_ecdsa_edge_cases_cold_109();
LAB_0015d837:
  test_ecdsa_edge_cases_cold_2();
LAB_0015d83c:
  test_ecdsa_edge_cases_cold_108();
LAB_0015d841:
  test_ecdsa_edge_cases_cold_3();
LAB_0015d846:
  test_ecdsa_edge_cases_cold_107();
LAB_0015d84b:
  test_ecdsa_edge_cases_cold_106();
LAB_0015d850:
  test_ecdsa_edge_cases_cold_105();
LAB_0015d855:
  test_ecdsa_edge_cases_cold_104();
LAB_0015d85a:
  test_ecdsa_edge_cases_cold_103();
LAB_0015d85f:
  test_ecdsa_edge_cases_cold_102();
LAB_0015d864:
  test_ecdsa_edge_cases_cold_4();
LAB_0015d869:
  test_ecdsa_edge_cases_cold_5();
LAB_0015d86e:
  test_ecdsa_edge_cases_cold_101();
LAB_0015d873:
  test_ecdsa_edge_cases_cold_100();
LAB_0015d878:
  test_ecdsa_edge_cases_cold_99();
LAB_0015d87d:
  test_ecdsa_edge_cases_cold_98();
LAB_0015d882:
  test_ecdsa_edge_cases_cold_97();
LAB_0015d887:
  test_ecdsa_edge_cases_cold_96();
LAB_0015d88c:
  test_ecdsa_edge_cases_cold_6();
LAB_0015d891:
  test_ecdsa_edge_cases_cold_7();
LAB_0015d896:
  test_ecdsa_edge_cases_cold_95();
LAB_0015d89b:
  test_ecdsa_edge_cases_cold_94();
LAB_0015d8a0:
  psVar11 = r;
  test_ecdsa_edge_cases_cold_93();
LAB_0015d8a5:
  test_ecdsa_edge_cases_cold_8();
  psVar10 = extraout_RAX;
LAB_0015d8aa:
  (*(psVar10->illegal_callback).fn)
            ("ctx != secp256k1_context_static",(psVar10->illegal_callback).data);
  psVar10 = CTX;
  goto LAB_0015c9c0;
  while (lVar9 = lVar9 + 1, lVar9 != 0x20) {
LAB_0015d6b9:
    if (local_4188[lVar9] != local_4168[lVar9]) goto LAB_0015d6da;
  }
  test_ecdsa_edge_cases_cold_81();
LAB_0015d6d0:
  test_ecdsa_edge_cases_cold_73();
LAB_0015d6d5:
  test_ecdsa_edge_cases_cold_71();
LAB_0015d6da:
  lVar9 = 0;
  do {
    if (local_4188[lVar9] != *(char *)((long)local_4118.d + lVar9)) goto LAB_0015d6f3;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0x20);
  test_ecdsa_edge_cases_cold_80();
LAB_0015d6f3:
  lVar9 = 0;
  do {
    if (local_4188[lVar9] != *(char *)((long)local_4138 + lVar9)) goto LAB_0015d70c;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0x20);
  test_ecdsa_edge_cases_cold_79();
LAB_0015d70c:
  lVar9 = 0;
  do {
    if (local_4168[lVar9] != *(char *)((long)local_4118.d + lVar9)) goto LAB_0015d726;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0x20);
  test_ecdsa_edge_cases_cold_78();
LAB_0015d726:
  lVar9 = 0;
  do {
    if (local_4168[lVar9] != *(char *)((long)local_4138 + lVar9)) goto LAB_0015d740;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0x20);
  test_ecdsa_edge_cases_cold_77();
LAB_0015d740:
  lVar9 = 0;
  do {
    if (*(char *)((long)local_4118.d + lVar9) != *(char *)((long)local_4138 + lVar9))
    goto LAB_0015d75a;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0x20);
  test_ecdsa_edge_cases_cold_76();
LAB_0015d75a:
  local_40e8._0_1_ = 0xba;
  local_40e8._1_1_ = 0xae;
  local_40e8._2_1_ = 0xdc;
  local_40e8._3_1_ = 0xe6;
  local_40e8._4_1_ = 0xaf;
  local_40e8._5_1_ = 'H';
  local_40e8._6_1_ = 0xa0;
  local_40e8._7_1_ = ';';
  uStack_40e0._0_1_ = 0xbf;
  uStack_40e0._1_1_ = 0xd2;
  uStack_40e0._2_1_ = '^';
  uStack_40e0._3_1_ = 0x8c;
  uStack_40e0._4_1_ = 0xd0;
  uStack_40e0._5_1_ = '6';
  uStack_40e0._6_1_ = 'A';
  uStack_40e0._7_1_ = 'A';
  uStack_40f0._0_1_ = 0xff;
  uStack_40f0._1_1_ = 0xff;
  uStack_40f0._2_1_ = 0xff;
  uStack_40f0._3_1_ = 0xff;
  uStack_40f0._4_1_ = 0xff;
  uStack_40f0._5_1_ = 0xff;
  uStack_40f0._6_1_ = 0xff;
  uStack_40f0._7_1_ = 0xfe;
  local_40f8[0] = 0xff;
  local_40f8[1] = 0xff;
  local_40f8[2] = 0xff;
  local_40f8[3] = 0xff;
  local_40f8[4] = 0xff;
  local_40f8[5] = 0xff;
  local_40f8[6] = 0xff;
  local_40f8[7] = 0xff;
  pcVar13 = (code *)0x0;
  psVar10 = CTX;
  iVar8 = ec_privkey_export_der(CTX,(uchar *)local_4038,(size_t *)local_4188,local_40f8,0);
  if (iVar8 == 0) {
    pcVar13 = (code *)0x1;
    psVar10 = CTX;
    iVar8 = ec_privkey_export_der(CTX,(uchar *)local_4038,(size_t *)local_4188,local_40f8,1);
    if (iVar8 == 0) {
      return;
    }
  }
  else {
LAB_0015da00:
    test_ecdsa_edge_cases_cold_74();
  }
  test_ecdsa_edge_cases_cold_75();
  uVar3 = *(undefined8 *)pcVar13;
  uVar4 = *(uint64_t *)(pcVar13 + 8);
  uVar5 = *(uint64_t *)(pcVar13 + 0x18);
  (psVar10->ecmult_gen_ctx).blind.d[1] = *(uint64_t *)(pcVar13 + 0x10);
  (psVar10->ecmult_gen_ctx).blind.d[2] = uVar5;
  *(undefined8 *)&psVar10->ecmult_gen_ctx = uVar3;
  (psVar10->ecmult_gen_ctx).blind.d[0] = uVar4;
  return;
}

Assistant:

static void test_ecdsa_edge_cases(void) {
    int t;
    secp256k1_ecdsa_signature sig;

    /* Test the case where ECDSA recomputes a point that is infinity. */
    {
        secp256k1_gej keyj;
        secp256k1_ge key;
        secp256k1_scalar msg;
        secp256k1_scalar sr, ss;
        secp256k1_scalar_set_int(&ss, 1);
        secp256k1_scalar_negate(&ss, &ss);
        secp256k1_scalar_inverse(&ss, &ss);
        secp256k1_scalar_set_int(&sr, 1);
        secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx, &keyj, &sr);
        secp256k1_ge_set_gej(&key, &keyj);
        msg = ss;
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 0);
    }

    /* Verify signature with r of zero fails. */
    {
        const unsigned char pubkey_mods_zero[33] = {
            0x02, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff,
            0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff,
            0xfe, 0xba, 0xae, 0xdc, 0xe6, 0xaf, 0x48, 0xa0,
            0x3b, 0xbf, 0xd2, 0x5e, 0x8c, 0xd0, 0x36, 0x41,
            0x41
        };
        secp256k1_ge key;
        secp256k1_scalar msg;
        secp256k1_scalar sr, ss;
        secp256k1_scalar_set_int(&ss, 1);
        secp256k1_scalar_set_int(&msg, 0);
        secp256k1_scalar_set_int(&sr, 0);
        CHECK(secp256k1_eckey_pubkey_parse(&key, pubkey_mods_zero, 33));
        CHECK(secp256k1_ecdsa_sig_verify( &sr, &ss, &key, &msg) == 0);
    }

    /* Verify signature with s of zero fails. */
    {
        const unsigned char pubkey[33] = {
            0x02, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x01
        };
        secp256k1_ge key;
        secp256k1_scalar msg;
        secp256k1_scalar sr, ss;
        secp256k1_scalar_set_int(&ss, 0);
        secp256k1_scalar_set_int(&msg, 0);
        secp256k1_scalar_set_int(&sr, 1);
        CHECK(secp256k1_eckey_pubkey_parse(&key, pubkey, 33));
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 0);
    }

    /* Verify signature with message 0 passes. */
    {
        const unsigned char pubkey[33] = {
            0x02, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x02
        };
        const unsigned char pubkey2[33] = {
            0x02, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff,
            0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff,
            0xfe, 0xba, 0xae, 0xdc, 0xe6, 0xaf, 0x48, 0xa0,
            0x3b, 0xbf, 0xd2, 0x5e, 0x8c, 0xd0, 0x36, 0x41,
            0x43
        };
        secp256k1_ge key;
        secp256k1_ge key2;
        secp256k1_scalar msg;
        secp256k1_scalar sr, ss;
        secp256k1_scalar_set_int(&ss, 2);
        secp256k1_scalar_set_int(&msg, 0);
        secp256k1_scalar_set_int(&sr, 2);
        CHECK(secp256k1_eckey_pubkey_parse(&key, pubkey, 33));
        CHECK(secp256k1_eckey_pubkey_parse(&key2, pubkey2, 33));
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 1);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key2, &msg) == 1);
        secp256k1_scalar_negate(&ss, &ss);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 1);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key2, &msg) == 1);
        secp256k1_scalar_set_int(&ss, 1);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 0);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key2, &msg) == 0);
    }

    /* Verify signature with message 1 passes. */
    {
        const unsigned char pubkey[33] = {
            0x02, 0x14, 0x4e, 0x5a, 0x58, 0xef, 0x5b, 0x22,
            0x6f, 0xd2, 0xe2, 0x07, 0x6a, 0x77, 0xcf, 0x05,
            0xb4, 0x1d, 0xe7, 0x4a, 0x30, 0x98, 0x27, 0x8c,
            0x93, 0xe6, 0xe6, 0x3c, 0x0b, 0xc4, 0x73, 0x76,
            0x25
        };
        const unsigned char pubkey2[33] = {
            0x02, 0x8a, 0xd5, 0x37, 0xed, 0x73, 0xd9, 0x40,
            0x1d, 0xa0, 0x33, 0xd2, 0xdc, 0xf0, 0xaf, 0xae,
            0x34, 0xcf, 0x5f, 0x96, 0x4c, 0x73, 0x28, 0x0f,
            0x92, 0xc0, 0xf6, 0x9d, 0xd9, 0xb2, 0x09, 0x10,
            0x62
        };
        const unsigned char csr[32] = {
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x01,
            0x45, 0x51, 0x23, 0x19, 0x50, 0xb7, 0x5f, 0xc4,
            0x40, 0x2d, 0xa1, 0x72, 0x2f, 0xc9, 0xba, 0xeb
        };
        secp256k1_ge key;
        secp256k1_ge key2;
        secp256k1_scalar msg;
        secp256k1_scalar sr, ss;
        secp256k1_scalar_set_int(&ss, 1);
        secp256k1_scalar_set_int(&msg, 1);
        secp256k1_scalar_set_b32(&sr, csr, NULL);
        CHECK(secp256k1_eckey_pubkey_parse(&key, pubkey, 33));
        CHECK(secp256k1_eckey_pubkey_parse(&key2, pubkey2, 33));
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 1);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key2, &msg) == 1);
        secp256k1_scalar_negate(&ss, &ss);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 1);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key2, &msg) == 1);
        secp256k1_scalar_set_int(&ss, 2);
        secp256k1_scalar_inverse_var(&ss, &ss);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 0);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key2, &msg) == 0);
    }

    /* Verify signature with message -1 passes. */
    {
        const unsigned char pubkey[33] = {
            0x03, 0xaf, 0x97, 0xff, 0x7d, 0x3a, 0xf6, 0xa0,
            0x02, 0x94, 0xbd, 0x9f, 0x4b, 0x2e, 0xd7, 0x52,
            0x28, 0xdb, 0x49, 0x2a, 0x65, 0xcb, 0x1e, 0x27,
            0x57, 0x9c, 0xba, 0x74, 0x20, 0xd5, 0x1d, 0x20,
            0xf1
        };
        const unsigned char csr[32] = {
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x01,
            0x45, 0x51, 0x23, 0x19, 0x50, 0xb7, 0x5f, 0xc4,
            0x40, 0x2d, 0xa1, 0x72, 0x2f, 0xc9, 0xba, 0xee
        };
        secp256k1_ge key;
        secp256k1_scalar msg;
        secp256k1_scalar sr, ss;
        secp256k1_scalar_set_int(&ss, 1);
        secp256k1_scalar_set_int(&msg, 1);
        secp256k1_scalar_negate(&msg, &msg);
        secp256k1_scalar_set_b32(&sr, csr, NULL);
        CHECK(secp256k1_eckey_pubkey_parse(&key, pubkey, 33));
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 1);
        secp256k1_scalar_negate(&ss, &ss);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 1);
        secp256k1_scalar_set_int(&ss, 3);
        secp256k1_scalar_inverse_var(&ss, &ss);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 0);
    }

    /* Signature where s would be zero. */
    {
        secp256k1_pubkey pubkey;
        size_t siglen;
        int32_t ecount;
        unsigned char signature[72];
        static const unsigned char nonce[32] = {
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x01,
        };
        static const unsigned char nonce2[32] = {
            0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,
            0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFE,
            0xBA,0xAE,0xDC,0xE6,0xAF,0x48,0xA0,0x3B,
            0xBF,0xD2,0x5E,0x8C,0xD0,0x36,0x41,0x40
        };
        const unsigned char key[32] = {
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x01,
        };
        unsigned char msg[32] = {
            0x86, 0x41, 0x99, 0x81, 0x06, 0x23, 0x44, 0x53,
            0xaa, 0x5f, 0x9d, 0x6a, 0x31, 0x78, 0xf4, 0xf7,
            0xb8, 0x12, 0xe0, 0x0b, 0x81, 0x7a, 0x77, 0x62,
            0x65, 0xdf, 0xdd, 0x31, 0xb9, 0x3e, 0x29, 0xa9,
        };
        ecount = 0;
        secp256k1_context_set_illegal_callback(CTX, counting_illegal_callback_fn, &ecount);
        CHECK(secp256k1_ecdsa_sign(CTX, &sig, msg, key, precomputed_nonce_function, nonce) == 0);
        CHECK(secp256k1_ecdsa_sign(CTX, &sig, msg, key, precomputed_nonce_function, nonce2) == 0);
        msg[31] = 0xaa;
        CHECK(secp256k1_ecdsa_sign(CTX, &sig, msg, key, precomputed_nonce_function, nonce) == 1);
        CHECK(ecount == 0);
        CHECK(secp256k1_ecdsa_sign(CTX, NULL, msg, key, precomputed_nonce_function, nonce2) == 0);
        CHECK(ecount == 1);
        CHECK(secp256k1_ecdsa_sign(CTX, &sig, NULL, key, precomputed_nonce_function, nonce2) == 0);
        CHECK(ecount == 2);
        CHECK(secp256k1_ecdsa_sign(CTX, &sig, msg, NULL, precomputed_nonce_function, nonce2) == 0);
        CHECK(ecount == 3);
        CHECK(secp256k1_ecdsa_sign(CTX, &sig, msg, key, precomputed_nonce_function, nonce2) == 1);
        CHECK(secp256k1_ec_pubkey_create(CTX, &pubkey, key) == 1);
        CHECK(secp256k1_ecdsa_verify(CTX, NULL, msg, &pubkey) == 0);
        CHECK(ecount == 4);
        CHECK(secp256k1_ecdsa_verify(CTX, &sig, NULL, &pubkey) == 0);
        CHECK(ecount == 5);
        CHECK(secp256k1_ecdsa_verify(CTX, &sig, msg, NULL) == 0);
        CHECK(ecount == 6);
        CHECK(secp256k1_ecdsa_verify(CTX, &sig, msg, &pubkey) == 1);
        CHECK(ecount == 6);
        CHECK(secp256k1_ec_pubkey_create(CTX, &pubkey, NULL) == 0);
        CHECK(ecount == 7);
        /* That pubkeyload fails via an ARGCHECK is a little odd but makes sense because pubkeys are an opaque data type. */
        CHECK(secp256k1_ecdsa_verify(CTX, &sig, msg, &pubkey) == 0);
        CHECK(ecount == 8);
        siglen = 72;
        CHECK(secp256k1_ecdsa_signature_serialize_der(CTX, NULL, &siglen, &sig) == 0);
        CHECK(ecount == 9);
        CHECK(secp256k1_ecdsa_signature_serialize_der(CTX, signature, NULL, &sig) == 0);
        CHECK(ecount == 10);
        CHECK(secp256k1_ecdsa_signature_serialize_der(CTX, signature, &siglen, NULL) == 0);
        CHECK(ecount == 11);
        CHECK(secp256k1_ecdsa_signature_serialize_der(CTX, signature, &siglen, &sig) == 1);
        CHECK(ecount == 11);
        CHECK(secp256k1_ecdsa_signature_parse_der(CTX, NULL, signature, siglen) == 0);
        CHECK(ecount == 12);
        CHECK(secp256k1_ecdsa_signature_parse_der(CTX, &sig, NULL, siglen) == 0);
        CHECK(ecount == 13);
        CHECK(secp256k1_ecdsa_signature_parse_der(CTX, &sig, signature, siglen) == 1);
        CHECK(ecount == 13);
        siglen = 10;
        /* Too little room for a signature does not fail via ARGCHECK. */
        CHECK(secp256k1_ecdsa_signature_serialize_der(CTX, signature, &siglen, &sig) == 0);
        CHECK(ecount == 13);
        ecount = 0;
        CHECK(secp256k1_ecdsa_signature_normalize(CTX, NULL, NULL) == 0);
        CHECK(ecount == 1);
        CHECK(secp256k1_ecdsa_signature_serialize_compact(CTX, NULL, &sig) == 0);
        CHECK(ecount == 2);
        CHECK(secp256k1_ecdsa_signature_serialize_compact(CTX, signature, NULL) == 0);
        CHECK(ecount == 3);
        CHECK(secp256k1_ecdsa_signature_serialize_compact(CTX, signature, &sig) == 1);
        CHECK(ecount == 3);
        CHECK(secp256k1_ecdsa_signature_parse_compact(CTX, NULL, signature) == 0);
        CHECK(ecount == 4);
        CHECK(secp256k1_ecdsa_signature_parse_compact(CTX, &sig, NULL) == 0);
        CHECK(ecount == 5);
        CHECK(secp256k1_ecdsa_signature_parse_compact(CTX, &sig, signature) == 1);
        CHECK(ecount == 5);
        memset(signature, 255, 64);
        CHECK(secp256k1_ecdsa_signature_parse_compact(CTX, &sig, signature) == 0);
        CHECK(ecount == 5);
        secp256k1_context_set_illegal_callback(CTX, NULL, NULL);
    }

    /* Nonce function corner cases. */
    for (t = 0; t < 2; t++) {
        static const unsigned char zero[32] = {0x00};
        int i;
        unsigned char key[32];
        unsigned char msg[32];
        secp256k1_ecdsa_signature sig2;
        secp256k1_scalar sr[512], ss;
        const unsigned char *extra;
        extra = t == 0 ? NULL : zero;
        memset(msg, 0, 32);
        msg[31] = 1;
        /* High key results in signature failure. */
        memset(key, 0xFF, 32);
        CHECK(secp256k1_ecdsa_sign(CTX, &sig, msg, key, NULL, extra) == 0);
        CHECK(is_empty_signature(&sig));
        /* Zero key results in signature failure. */
        memset(key, 0, 32);
        CHECK(secp256k1_ecdsa_sign(CTX, &sig, msg, key, NULL, extra) == 0);
        CHECK(is_empty_signature(&sig));
        /* Nonce function failure results in signature failure. */
        key[31] = 1;
        CHECK(secp256k1_ecdsa_sign(CTX, &sig, msg, key, nonce_function_test_fail, extra) == 0);
        CHECK(is_empty_signature(&sig));
        /* The retry loop successfully makes its way to the first good value. */
        CHECK(secp256k1_ecdsa_sign(CTX, &sig, msg, key, nonce_function_test_retry, extra) == 1);
        CHECK(!is_empty_signature(&sig));
        CHECK(secp256k1_ecdsa_sign(CTX, &sig2, msg, key, nonce_function_rfc6979, extra) == 1);
        CHECK(!is_empty_signature(&sig2));
        CHECK(secp256k1_memcmp_var(&sig, &sig2, sizeof(sig)) == 0);
        /* The default nonce function is deterministic. */
        CHECK(secp256k1_ecdsa_sign(CTX, &sig2, msg, key, NULL, extra) == 1);
        CHECK(!is_empty_signature(&sig2));
        CHECK(secp256k1_memcmp_var(&sig, &sig2, sizeof(sig)) == 0);
        /* The default nonce function changes output with different messages. */
        for(i = 0; i < 256; i++) {
            int j;
            msg[0] = i;
            CHECK(secp256k1_ecdsa_sign(CTX, &sig2, msg, key, NULL, extra) == 1);
            CHECK(!is_empty_signature(&sig2));
            secp256k1_ecdsa_signature_load(CTX, &sr[i], &ss, &sig2);
            for (j = 0; j < i; j++) {
                CHECK(!secp256k1_scalar_eq(&sr[i], &sr[j]));
            }
        }
        msg[0] = 0;
        msg[31] = 2;
        /* The default nonce function changes output with different keys. */
        for(i = 256; i < 512; i++) {
            int j;
            key[0] = i - 256;
            CHECK(secp256k1_ecdsa_sign(CTX, &sig2, msg, key, NULL, extra) == 1);
            CHECK(!is_empty_signature(&sig2));
            secp256k1_ecdsa_signature_load(CTX, &sr[i], &ss, &sig2);
            for (j = 0; j < i; j++) {
                CHECK(!secp256k1_scalar_eq(&sr[i], &sr[j]));
            }
        }
        key[0] = 0;
    }

    {
        /* Check that optional nonce arguments do not have equivalent effect. */
        const unsigned char zeros[32] = {0};
        unsigned char nonce[32];
        unsigned char nonce2[32];
        unsigned char nonce3[32];
        unsigned char nonce4[32];
        SECP256K1_CHECKMEM_UNDEFINE(nonce,32);
        SECP256K1_CHECKMEM_UNDEFINE(nonce2,32);
        SECP256K1_CHECKMEM_UNDEFINE(nonce3,32);
        SECP256K1_CHECKMEM_UNDEFINE(nonce4,32);
        CHECK(nonce_function_rfc6979(nonce, zeros, zeros, NULL, NULL, 0) == 1);
        SECP256K1_CHECKMEM_CHECK(nonce,32);
        CHECK(nonce_function_rfc6979(nonce2, zeros, zeros, zeros, NULL, 0) == 1);
        SECP256K1_CHECKMEM_CHECK(nonce2,32);
        CHECK(nonce_function_rfc6979(nonce3, zeros, zeros, NULL, (void *)zeros, 0) == 1);
        SECP256K1_CHECKMEM_CHECK(nonce3,32);
        CHECK(nonce_function_rfc6979(nonce4, zeros, zeros, zeros, (void *)zeros, 0) == 1);
        SECP256K1_CHECKMEM_CHECK(nonce4,32);
        CHECK(secp256k1_memcmp_var(nonce, nonce2, 32) != 0);
        CHECK(secp256k1_memcmp_var(nonce, nonce3, 32) != 0);
        CHECK(secp256k1_memcmp_var(nonce, nonce4, 32) != 0);
        CHECK(secp256k1_memcmp_var(nonce2, nonce3, 32) != 0);
        CHECK(secp256k1_memcmp_var(nonce2, nonce4, 32) != 0);
        CHECK(secp256k1_memcmp_var(nonce3, nonce4, 32) != 0);
    }


    /* Privkey export where pubkey is the point at infinity. */
    {
        unsigned char privkey[300];
        unsigned char seckey[32] = {
            0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff,
            0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xfe,
            0xba, 0xae, 0xdc, 0xe6, 0xaf, 0x48, 0xa0, 0x3b,
            0xbf, 0xd2, 0x5e, 0x8c, 0xd0, 0x36, 0x41, 0x41,
        };
        size_t outlen = 300;
        CHECK(!ec_privkey_export_der(CTX, privkey, &outlen, seckey, 0));
        outlen = 300;
        CHECK(!ec_privkey_export_der(CTX, privkey, &outlen, seckey, 1));
    }
}